

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inet_socket_address.c
# Opt level: O0

void test_init_inet_socket_address_wrong_family(void)

{
  undefined1 local_98 [8];
  cio_socket_address sock_addr;
  cio_error err;
  cio_inet_address address;
  uint8_t ipv4_address [4];
  
  address.impl.field_1._8_4_ = 0x10113ac;
  sock_addr.impl.sa._104_4_ =
       cio_init_inet_address
                 ((cio_inet_address *)(sock_addr.impl.sa.unix_address.un.sun_path + 0x6a),
                  (uint8_t *)((long)&address.impl.field_1 + 8),4);
  UnityAssertEqualNumber
            (0,(long)(int)sock_addr.impl.sa._104_4_,"initialization of IPv4 inet address failed!",
             0x54,UNITY_DISPLAY_STYLE_INT);
  sock_addr.impl.sa._108_4_ = 0;
  sock_addr.impl.sa._104_4_ =
       cio_init_inet_socket_address
                 ((cio_socket_address *)local_98,
                  (cio_inet_address *)(sock_addr.impl.sa.unix_address.un.sun_path + 0x6a),0xc);
  UnityAssertEqualNumber
            (-0x61,(long)(int)sock_addr.impl.sa._104_4_,
             "initialization of inet socket address did not fail with wrong address family!",0x59,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_init_inet_socket_address_wrong_family(void)
{
	uint8_t ipv4_address[4] = {172, 19, 1, 1};
	struct cio_inet_address address;
	enum cio_error err = cio_init_inet_address(&address, ipv4_address, sizeof(ipv4_address));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "initialization of IPv4 inet address failed!");

	address.impl.family = CIO_ADDRESS_FAMILY_UNSPEC;
	struct cio_socket_address sock_addr;
	err = cio_init_inet_socket_address(&sock_addr, &address, 12);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_ADDRESS_FAMILY_NOT_SUPPORTED, err, "initialization of inet socket address did not fail with wrong address family!");
}